

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_reduce_512(secp256k1_scalar *r,uint64_t *l)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  
  uVar22 = l[4];
  uVar23 = l[5];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar22;
  uVar19 = SUB168(auVar1 * ZEXT816(0x402da1732fc9bebf),0);
  uVar26 = SUB168(auVar1 * ZEXT816(0x402da1732fc9bebf),8) + l[1] + (ulong)CARRY8(uVar19,*l);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar23;
  uVar20 = SUB168(auVar2 * ZEXT816(0x402da1732fc9bebf),0);
  uVar24 = uVar20 + uVar26;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar22;
  uVar21 = SUB168(auVar3 * ZEXT816(0x4551231950b75fc4),0);
  uVar25 = uVar21 + uVar24;
  auVar17._8_8_ = uVar25;
  auVar17._0_8_ = uVar19 + *l;
  uVar26 = SUB168(auVar3 * ZEXT816(0x4551231950b75fc4),8) +
           SUB168(auVar2 * ZEXT816(0x402da1732fc9bebf),8) + l[2] + (ulong)(uVar26 < l[1]) +
           (ulong)CARRY8(uVar20,uVar26) + (ulong)CARRY8(uVar21,uVar24);
  uVar19 = l[6];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar19;
  uVar21 = SUB168(auVar4 * ZEXT816(0x402da1732fc9bebf),0);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar23;
  uVar24 = SUB168(auVar5 * ZEXT816(0x4551231950b75fc4),0);
  uVar27 = uVar21 + uVar26;
  uVar20 = l[7];
  uVar28 = uVar27 + uVar24;
  uVar29 = uVar28 + uVar22;
  uVar30 = (ulong)CARRY8(uVar27,uVar24) +
           SUB168(auVar5 * ZEXT816(0x4551231950b75fc4),8) +
           SUB168(auVar4 * ZEXT816(0x402da1732fc9bebf),8) + l[3] + (ulong)(uVar26 < l[2]) +
           (ulong)CARRY8(uVar21,uVar26) + (ulong)CARRY8(uVar28,uVar22);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar20;
  uVar22 = SUB168(auVar6 * ZEXT816(0x402da1732fc9bebf),0);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar19;
  uVar21 = SUB168(auVar7 * ZEXT816(0x4551231950b75fc4),0);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar20;
  auVar16._8_8_ = 1;
  auVar16._0_8_ = 0x4551231950b75fc4;
  uVar24 = SUB168(auVar8 * ZEXT816(0x4551231950b75fc4),0);
  uVar26 = uVar22 + uVar30;
  uVar27 = uVar26 + uVar21;
  uVar28 = uVar27 + uVar23;
  uVar22 = (ulong)CARRY8(uVar26,uVar21) +
           SUB168(auVar7 * ZEXT816(0x4551231950b75fc4),8) +
           SUB168(auVar6 * ZEXT816(0x402da1732fc9bebf),8) + uVar24 + (ulong)(uVar30 < l[3]) +
           (ulong)CARRY8(uVar22,uVar30) + (ulong)CARRY8(uVar27,uVar23);
  uVar26 = uVar22 + uVar19;
  uVar21 = SUB168(auVar8 * auVar16,8) + (ulong)(uVar22 < uVar24) + (ulong)CARRY8(uVar22,uVar19);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar26;
  auVar17 = auVar9 * ZEXT816(0x402da1732fc9bebf) + auVar17;
  uVar22 = auVar17._0_8_;
  uVar27 = auVar17._8_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar21;
  uVar23 = SUB168(auVar10 * ZEXT816(0x402da1732fc9bebf),0);
  uVar24 = uVar23 + uVar27;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar26;
  uVar19 = SUB168(auVar11 * ZEXT816(0x4551231950b75fc4),0);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar19 + uVar24;
  uVar23 = uVar29 + SUB168(auVar11 * ZEXT816(0x4551231950b75fc4),8) +
           SUB168(auVar10 * ZEXT816(0x402da1732fc9bebf),8) + (ulong)(uVar27 < uVar25) +
           (ulong)CARRY8(uVar23,uVar27) + (ulong)CARRY8(uVar19,uVar24);
  uVar24 = 0;
  uVar19 = 0;
  if (uVar21 < uVar20) {
    uVar19 = 0x402da1732fc9bebf;
  }
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar21;
  uVar27 = SUB168(auVar12 * ZEXT816(0x4551231950b75fc4),0);
  uVar25 = uVar19 + uVar23 + uVar27;
  uVar30 = uVar25 + uVar26;
  uVar23 = (ulong)CARRY8(uVar19 + uVar23,uVar27) +
           uVar28 + SUB168(auVar12 * ZEXT816(0x4551231950b75fc4),8) + (ulong)(uVar23 < uVar29) +
           (ulong)CARRY8(uVar19,uVar23) + (ulong)CARRY8(uVar25,uVar26);
  if (uVar21 < uVar20) {
    uVar24 = 0x4551231950b75fc4;
  }
  uVar27 = uVar24 + uVar23 + uVar21;
  uVar20 = CONCAT44(0,(uint)CARRY8(uVar24,uVar23) +
                      (uint)(uVar23 < uVar28) + (uint)(uVar21 < uVar20) +
                      (uint)CARRY8(uVar24 + uVar23,uVar21));
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar20;
  uVar21 = SUB168(auVar13 * ZEXT816(0x402da1732fc9bebf),8);
  uVar23 = SUB168(auVar13 * ZEXT816(0x402da1732fc9bebf),0);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar20;
  auVar15 = auVar14 * ZEXT816(0x4551231950b75fc4) + auVar15;
  uVar19 = auVar15._0_8_;
  uVar24 = auVar15._8_8_;
  uVar26 = uVar30 + uVar20;
  uVar20 = (ulong)CARRY8(uVar30,uVar20);
  r->d[0] = uVar23 + uVar22;
  uVar22 = (ulong)CARRY8(uVar23,uVar22);
  uVar23 = uVar19 + uVar21;
  r->d[1] = uVar23 + uVar22;
  uVar22 = (ulong)(CARRY8(uVar19,uVar21) || CARRY8(uVar23,uVar22));
  uVar23 = uVar26 + uVar24;
  r->d[2] = uVar23 + uVar22;
  uVar22 = (ulong)(CARRY8(uVar26,uVar24) || CARRY8(uVar23,uVar22));
  uVar23 = uVar20 + uVar27;
  r->d[3] = uVar23 + uVar22;
  iVar18 = secp256k1_scalar_check_overflow(r);
  secp256k1_scalar_reduce(r,iVar18 + (uint)(CARRY8(uVar20,uVar27) || CARRY8(uVar23,uVar22)));
  return;
}

Assistant:

static void secp256k1_scalar_reduce_512(secp256k1_scalar *r, const uint64_t *l) {
#ifdef USE_ASM_X86_64
    /* Reduce 512 bits into 385. */
    uint64_t m0, m1, m2, m3, m4, m5, m6;
    uint64_t p0, p1, p2, p3, p4;
    uint64_t c;

    __asm__ __volatile__(
    /* Preload. */
    "movq 32(%%rsi), %%r11\n"
    "movq 40(%%rsi), %%r12\n"
    "movq 48(%%rsi), %%r13\n"
    "movq 56(%%rsi), %%r14\n"
    /* Initialize r8,r9,r10 */
    "movq 0(%%rsi), %%r8\n"
    "xorq %%r9, %%r9\n"
    "xorq %%r10, %%r10\n"
    /* (r8,r9) += n0 * c0 */
    "movq %8, %%rax\n"
    "mulq %%r11\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    /* extract m0 */
    "movq %%r8, %q0\n"
    "xorq %%r8, %%r8\n"
    /* (r9,r10) += l1 */
    "addq 8(%%rsi), %%r9\n"
    "adcq $0, %%r10\n"
    /* (r9,r10,r8) += n1 * c0 */
    "movq %8, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* (r9,r10,r8) += n0 * c1 */
    "movq %9, %%rax\n"
    "mulq %%r11\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* extract m1 */
    "movq %%r9, %q1\n"
    "xorq %%r9, %%r9\n"
    /* (r10,r8,r9) += l2 */
    "addq 16(%%rsi), %%r10\n"
    "adcq $0, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += n2 * c0 */
    "movq %8, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += n1 * c1 */
    "movq %9, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += n0 */
    "addq %%r11, %%r10\n"
    "adcq $0, %%r8\n"
    "adcq $0, %%r9\n"
    /* extract m2 */
    "movq %%r10, %q2\n"
    "xorq %%r10, %%r10\n"
    /* (r8,r9,r10) += l3 */
    "addq 24(%%rsi), %%r8\n"
    "adcq $0, %%r9\n"
    "adcq $0, %%r10\n"
    /* (r8,r9,r10) += n3 * c0 */
    "movq %8, %%rax\n"
    "mulq %%r14\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    "adcq $0, %%r10\n"
    /* (r8,r9,r10) += n2 * c1 */
    "movq %9, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    "adcq $0, %%r10\n"
    /* (r8,r9,r10) += n1 */
    "addq %%r12, %%r8\n"
    "adcq $0, %%r9\n"
    "adcq $0, %%r10\n"
    /* extract m3 */
    "movq %%r8, %q3\n"
    "xorq %%r8, %%r8\n"
    /* (r9,r10,r8) += n3 * c1 */
    "movq %9, %%rax\n"
    "mulq %%r14\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* (r9,r10,r8) += n2 */
    "addq %%r13, %%r9\n"
    "adcq $0, %%r10\n"
    "adcq $0, %%r8\n"
    /* extract m4 */
    "movq %%r9, %q4\n"
    /* (r10,r8) += n3 */
    "addq %%r14, %%r10\n"
    "adcq $0, %%r8\n"
    /* extract m5 */
    "movq %%r10, %q5\n"
    /* extract m6 */
    "movq %%r8, %q6\n"
    : "=g"(m0), "=g"(m1), "=g"(m2), "=g"(m3), "=g"(m4), "=g"(m5), "=g"(m6)
    : "S"(l), "n"(SECP256K1_N_C_0), "n"(SECP256K1_N_C_1)
    : "rax", "rdx", "r8", "r9", "r10", "r11", "r12", "r13", "r14", "cc");

    /* Reduce 385 bits into 258. */
    __asm__ __volatile__(
    /* Preload */
    "movq %q9, %%r11\n"
    "movq %q10, %%r12\n"
    "movq %q11, %%r13\n"
    /* Initialize (r8,r9,r10) */
    "movq %q5, %%r8\n"
    "xorq %%r9, %%r9\n"
    "xorq %%r10, %%r10\n"
    /* (r8,r9) += m4 * c0 */
    "movq %12, %%rax\n"
    "mulq %%r11\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    /* extract p0 */
    "movq %%r8, %q0\n"
    "xorq %%r8, %%r8\n"
    /* (r9,r10) += m1 */
    "addq %q6, %%r9\n"
    "adcq $0, %%r10\n"
    /* (r9,r10,r8) += m5 * c0 */
    "movq %12, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* (r9,r10,r8) += m4 * c1 */
    "movq %13, %%rax\n"
    "mulq %%r11\n"
    "addq %%rax, %%r9\n"
    "adcq %%rdx, %%r10\n"
    "adcq $0, %%r8\n"
    /* extract p1 */
    "movq %%r9, %q1\n"
    "xorq %%r9, %%r9\n"
    /* (r10,r8,r9) += m2 */
    "addq %q7, %%r10\n"
    "adcq $0, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += m6 * c0 */
    "movq %12, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += m5 * c1 */
    "movq %13, %%rax\n"
    "mulq %%r12\n"
    "addq %%rax, %%r10\n"
    "adcq %%rdx, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r10,r8,r9) += m4 */
    "addq %%r11, %%r10\n"
    "adcq $0, %%r8\n"
    "adcq $0, %%r9\n"
    /* extract p2 */
    "movq %%r10, %q2\n"
    /* (r8,r9) += m3 */
    "addq %q8, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r8,r9) += m6 * c1 */
    "movq %13, %%rax\n"
    "mulq %%r13\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    /* (r8,r9) += m5 */
    "addq %%r12, %%r8\n"
    "adcq $0, %%r9\n"
    /* extract p3 */
    "movq %%r8, %q3\n"
    /* (r9) += m6 */
    "addq %%r13, %%r9\n"
    /* extract p4 */
    "movq %%r9, %q4\n"
    : "=&g"(p0), "=&g"(p1), "=&g"(p2), "=g"(p3), "=g"(p4)
    : "g"(m0), "g"(m1), "g"(m2), "g"(m3), "g"(m4), "g"(m5), "g"(m6), "n"(SECP256K1_N_C_0), "n"(SECP256K1_N_C_1)
    : "rax", "rdx", "r8", "r9", "r10", "r11", "r12", "r13", "cc");

    /* Reduce 258 bits into 256. */
    __asm__ __volatile__(
    /* Preload */
    "movq %q5, %%r10\n"
    /* (rax,rdx) = p4 * c0 */
    "movq %7, %%rax\n"
    "mulq %%r10\n"
    /* (rax,rdx) += p0 */
    "addq %q1, %%rax\n"
    "adcq $0, %%rdx\n"
    /* extract r0 */
    "movq %%rax, 0(%q6)\n"
    /* Move to (r8,r9) */
    "movq %%rdx, %%r8\n"
    "xorq %%r9, %%r9\n"
    /* (r8,r9) += p1 */
    "addq %q2, %%r8\n"
    "adcq $0, %%r9\n"
    /* (r8,r9) += p4 * c1 */
    "movq %8, %%rax\n"
    "mulq %%r10\n"
    "addq %%rax, %%r8\n"
    "adcq %%rdx, %%r9\n"
    /* Extract r1 */
    "movq %%r8, 8(%q6)\n"
    "xorq %%r8, %%r8\n"
    /* (r9,r8) += p4 */
    "addq %%r10, %%r9\n"
    "adcq $0, %%r8\n"
    /* (r9,r8) += p2 */
    "addq %q3, %%r9\n"
    "adcq $0, %%r8\n"
    /* Extract r2 */
    "movq %%r9, 16(%q6)\n"
    "xorq %%r9, %%r9\n"
    /* (r8,r9) += p3 */
    "addq %q4, %%r8\n"
    "adcq $0, %%r9\n"
    /* Extract r3 */
    "movq %%r8, 24(%q6)\n"
    /* Extract c */
    "movq %%r9, %q0\n"
    : "=g"(c)
    : "g"(p0), "g"(p1), "g"(p2), "g"(p3), "g"(p4), "D"(r), "n"(SECP256K1_N_C_0), "n"(SECP256K1_N_C_1)
    : "rax", "rdx", "r8", "r9", "r10", "cc", "memory");
#else
    uint128_t c;
    uint64_t c0, c1, c2;
    uint64_t n0 = l[4], n1 = l[5], n2 = l[6], n3 = l[7];
    uint64_t m0, m1, m2, m3, m4, m5;
    uint32_t m6;
    uint64_t p0, p1, p2, p3;
    uint32_t p4;

    /* Reduce 512 bits into 385. */
    /* m[0..6] = l[0..3] + n[0..3] * SECP256K1_N_C. */
    c0 = l[0]; c1 = 0; c2 = 0;
    muladd_fast(n0, SECP256K1_N_C_0);
    extract_fast(m0);
    sumadd_fast(l[1]);
    muladd(n1, SECP256K1_N_C_0);
    muladd(n0, SECP256K1_N_C_1);
    extract(m1);
    sumadd(l[2]);
    muladd(n2, SECP256K1_N_C_0);
    muladd(n1, SECP256K1_N_C_1);
    sumadd(n0);
    extract(m2);
    sumadd(l[3]);
    muladd(n3, SECP256K1_N_C_0);
    muladd(n2, SECP256K1_N_C_1);
    sumadd(n1);
    extract(m3);
    muladd(n3, SECP256K1_N_C_1);
    sumadd(n2);
    extract(m4);
    sumadd_fast(n3);
    extract_fast(m5);
    VERIFY_CHECK(c0 <= 1);
    m6 = c0;

    /* Reduce 385 bits into 258. */
    /* p[0..4] = m[0..3] + m[4..6] * SECP256K1_N_C. */
    c0 = m0; c1 = 0; c2 = 0;
    muladd_fast(m4, SECP256K1_N_C_0);
    extract_fast(p0);
    sumadd_fast(m1);
    muladd(m5, SECP256K1_N_C_0);
    muladd(m4, SECP256K1_N_C_1);
    extract(p1);
    sumadd(m2);
    muladd(m6, SECP256K1_N_C_0);
    muladd(m5, SECP256K1_N_C_1);
    sumadd(m4);
    extract(p2);
    sumadd_fast(m3);
    muladd_fast(m6, SECP256K1_N_C_1);
    sumadd_fast(m5);
    extract_fast(p3);
    p4 = c0 + m6;
    VERIFY_CHECK(p4 <= 2);

    /* Reduce 258 bits into 256. */
    /* r[0..3] = p[0..3] + p[4] * SECP256K1_N_C. */
    c = p0 + (uint128_t)SECP256K1_N_C_0 * p4;
    r->d[0] = c & 0xFFFFFFFFFFFFFFFFULL; c >>= 64;
    c += p1 + (uint128_t)SECP256K1_N_C_1 * p4;
    r->d[1] = c & 0xFFFFFFFFFFFFFFFFULL; c >>= 64;
    c += p2 + (uint128_t)p4;
    r->d[2] = c & 0xFFFFFFFFFFFFFFFFULL; c >>= 64;
    c += p3;
    r->d[3] = c & 0xFFFFFFFFFFFFFFFFULL; c >>= 64;
#endif

    /* Final reduction of r. */
    secp256k1_scalar_reduce(r, c + secp256k1_scalar_check_overflow(r));
}